

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> * __thiscall
vkb::detail::
get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*&>
          (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
           *__return_storage_ptr__,detail *this,
          _func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **f,
          VkPhysicalDevice_T **ts)

{
  VkPhysicalDevice_T *pVVar1;
  _func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr *p_Var2;
  VkQueueFamilyProperties *pVVar3;
  uint local_24;
  _func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **pp_Stack_20;
  uint32_t count;
  VkPhysicalDevice_T **ts_local;
  _func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **f_local;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *results;
  
  local_24 = 0;
  pp_Stack_20 = f;
  ts_local = (VkPhysicalDevice_T **)this;
  f_local = (_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)
            __return_storage_ptr__;
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::vector
            (__return_storage_ptr__);
  (*(code *)*ts_local)(*pp_Stack_20,&local_24,0);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::resize
            (__return_storage_ptr__,(ulong)local_24);
  pVVar1 = *ts_local;
  p_Var2 = *pp_Stack_20;
  pVVar3 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::data
                     (__return_storage_ptr__);
  (*(code *)pVVar1)(p_Var2,&local_24,pVVar3);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::resize
            (__return_storage_ptr__,(ulong)local_24);
  return __return_storage_ptr__;
}

Assistant:

auto get_vector_noerror(F&& f, Ts&&... ts) -> std::vector<T> {
    uint32_t count = 0;
    std::vector<T> results;
    f(ts..., &count, nullptr);
    results.resize(count);
    f(ts..., &count, results.data());
    results.resize(count);
    return results;
}